

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_lsd.cpp
# Opt level: O3

void msd_lsd_adaptive<10u>(Cacheblock<10U> *cache,size_t N,size_t depth)

{
  undefined8 *puVar1;
  bool bVar2;
  undefined8 uVar3;
  uchar *puVar4;
  void *__src;
  long lVar5;
  Cacheblock<10U> *pCVar6;
  size_t sVar7;
  size_t sVar8;
  ushort uVar9;
  ulong N_00;
  ulong uVar10;
  uchar *puVar11;
  long alStack_80038 [65537];
  
  N_00 = N;
  if (0xffff < N) {
    do {
      fill_cache<10u>(cache,N_00,depth);
      puVar11 = (cache->chars)._M_elems + 9;
      uVar10 = 9;
      do {
        memset(alStack_80038,0,0x80000);
        puVar4 = puVar11;
        sVar7 = N_00;
        do {
          alStack_80038[(ushort)(*(ushort *)(puVar4 + -1) << 8 | *(ushort *)(puVar4 + -1) >> 8)] =
               alStack_80038
               [(ushort)(*(ushort *)(puVar4 + -1) << 8 | *(ushort *)(puVar4 + -1) >> 8)] + 1;
          puVar4 = puVar4 + 0x18;
          sVar7 = sVar7 - 1;
        } while (sVar7 != 0);
        __src = malloc(N_00 * 0x18);
        msd_lsd_adaptive<10U>::bucketindex[0] = 0;
        lVar5 = 0;
        sVar7 = 0;
        do {
          sVar7 = sVar7 + alStack_80038[lVar5];
          msd_lsd_adaptive<10U>::bucketindex[lVar5 + 1] = sVar7;
          lVar5 = lVar5 + 1;
          pCVar6 = cache;
          sVar8 = N_00;
        } while (lVar5 != 0xffff);
        do {
          uVar9 = *(ushort *)((pCVar6->chars)._M_elems + (uVar10 - 1));
          uVar9 = uVar9 << 8 | uVar9 >> 8;
          sVar7 = msd_lsd_adaptive<10U>::bucketindex[uVar9];
          msd_lsd_adaptive<10U>::bucketindex[uVar9] = sVar7 + 1;
          *(uchar **)((long)__src + sVar7 * 0x18 + 0x10) = pCVar6->ptr;
          uVar3 = *(undefined8 *)((pCVar6->chars)._M_elems + 8);
          puVar1 = (undefined8 *)((long)__src + sVar7 * 0x18);
          *puVar1 = *(undefined8 *)(pCVar6->chars)._M_elems;
          puVar1[1] = uVar3;
          sVar8 = sVar8 - 1;
          pCVar6 = pCVar6 + 1;
        } while (sVar8 != 0);
        memcpy(cache,__src,N_00 * 0x18);
        free(__src);
        puVar11 = puVar11 + -2;
        bVar2 = 2 < uVar10;
        uVar10 = uVar10 - 2;
      } while (bVar2);
      if (N_00 == 1) {
        return;
      }
      depth = depth + 10;
      sVar8 = 1;
      N = 1;
      sVar7 = 0;
      pCVar6 = cache;
      do {
        if (*(short *)((pCVar6->chars)._M_elems + 8) == *(short *)(pCVar6[1].chars._M_elems + 8) &&
            *(long *)(pCVar6->chars)._M_elems == *(long *)pCVar6[1].chars._M_elems) {
          N = N + 1;
        }
        else {
          if ((1 < N) && (cache[sVar7].chars._M_elems[9] != '\0')) {
            msd_lsd_adaptive<10u>(cache + sVar7,N,depth);
          }
          N = 1;
          sVar7 = sVar8;
        }
        sVar8 = sVar8 + 1;
        pCVar6 = pCVar6 + 1;
      } while (N_00 != sVar8);
      if (N < 2) {
        return;
      }
      if (cache[sVar7].chars._M_elems[9] == '\0') {
        return;
      }
      cache = cache + sVar7;
      N_00 = N;
    } while (0xffff < N);
  }
  msd_lsd<10u>(cache,N,depth);
  return;
}

Assistant:

static void
msd_lsd_adaptive(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	static_assert(CachedChars%2==0, "CachedChars%2==0");
	static_assert(CachedChars>=2,   "CachedChars>=2");
	if (N < 0x10000) {
		msd_lsd(cache, N, depth);
		return;
	}
	fill_cache(cache, N, depth);
	for (int byte=CachedChars-1; byte > 0; byte -= 2) {
		size_t bucketsize[0x10000] = {0};
		for (size_t i=0; i < N; ++i) {
			uint16_t bucket =
				(cache[i].chars[byte-1] << 8) | cache[i].chars[byte];
			++bucketsize[bucket];
		}
		Cacheblock<CachedChars>* sorted = (Cacheblock<CachedChars>*)
			malloc(N*sizeof(Cacheblock<CachedChars>));
		static size_t bucketindex[0x10000];
		bucketindex[0] = 0;
		for (size_t i=1; i < 0x10000; ++i)
			bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
		for (size_t i=0; i < N; ++i) {
			uint16_t bucket =
				(cache[i].chars[byte-1] << 8) | cache[i].chars[byte];
			memcpy(&sorted[bucketindex[bucket]++],
					cache+i,
					sizeof(Cacheblock<CachedChars>));
		}
		memcpy(cache, sorted, N*sizeof(Cacheblock<CachedChars>));
		free(sorted);
	}
	size_t start=0, cnt=1;
	for (size_t i=0; i < N-1; ++i) {
		if (memcmp(cache[i].chars.data(), cache[i+1].chars.data(),
				CachedChars) == 0) {
			++cnt;
			continue;
		}
		if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
			msd_lsd_adaptive(cache+start, cnt, depth+CachedChars);
		}
		cnt = 1;
		start = i+1;
	}
	if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
		msd_lsd_adaptive(cache+start, cnt, depth+CachedChars);
	}
}